

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O0

void __thiscall DbaseCtrlBlk::get_first_blk(DbaseCtrlBlk *this)

{
  ssize_t sVar1;
  DbaseCtrlBlk *this_local;
  
  this->readall = '\0';
  lseek(this->fd,0,0);
  sVar1 = read(this->fd,this->buf,(long)(this->buf_size * 4));
  this->cur_blk_size = sVar1 / 4;
  this->cur_buf_pos = 0;
  return;
}

Assistant:

void DbaseCtrlBlk::get_first_blk() {
    readall = 0;
    lseek(fd, 0, SEEK_SET);
    cur_blk_size = (read(fd, (void *) buf, (buf_size * INT_SIZE))) / INT_SIZE;
    if (cur_blk_size < 0) {
        throw runtime_error("get_first_blk");
    }
    cur_buf_pos = 0;
}